

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

int traverseephemeron(global_State *g,Table *h,int inv)

{
  LuaType LVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  GCObject **list;
  GCObject *pGVar6;
  Node *pNVar7;
  long lVar8;
  ulong uVar9;
  Node *n;
  int local_34;
  
  n = h->node;
  uVar4 = h->sizearray;
  pNVar7 = n + (1 << (h->lsizenode & 0x1f));
  if (uVar4 == 0) {
    local_34 = 0;
  }
  else {
    lVar8 = 8;
    uVar9 = 0;
    local_34 = 0;
    do {
      if ((*(short *)((long)&h->array->value_ + lVar8) < 0) &&
         (pGVar6 = *(GCObject **)((long)h->array + lVar8 + -8), (pGVar6->marked & 0x18) != 0)) {
        reallymarkobject(g,pGVar6);
        uVar4 = h->sizearray;
        local_34 = 1;
      }
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x10;
    } while (uVar9 < uVar4);
    n = h->node;
  }
  if (n < pNVar7) {
    bVar2 = false;
    bVar3 = false;
    do {
      if ((n->i_val).tt_ == 0) {
        removeentry(n);
      }
      else {
        if ((short)(n->i_key).nk.tt_ < 0) {
          pGVar6 = (n->i_key).nk.value_.gc;
        }
        else {
          pGVar6 = (GCObject *)0x0;
        }
        iVar5 = iscleared(g,pGVar6);
        LVar1 = (n->i_val).tt_;
        if (iVar5 == 0) {
          if (((short)LVar1 < 0) && (pGVar6 = (n->i_val).value_.gc, (pGVar6->marked & 0x18) != 0)) {
            reallymarkobject(g,pGVar6);
            local_34 = 1;
          }
        }
        else {
          bVar3 = true;
          if (((short)LVar1 < 0) && ((((n->i_val).value_.gc)->marked & 0x18) != 0)) {
            bVar2 = true;
          }
        }
      }
      n = n + 1;
    } while (n < pNVar7);
    if (g->gcstate != '\0') {
      if (bVar2) {
        if ((h->tt & 0xe) < 10) {
          linkgclist_((GCObject *)h,&h->gclist,&g->ephemeron);
          return local_34;
        }
        __assert_fail("(((h)->tt) & 0x0F) < (9+1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x255,"int traverseephemeron(global_State *, Table *, int)");
      }
      if (!bVar3) goto LAB_0011cb7a;
      if (9 < (h->tt & 0xe)) {
        __assert_fail("(((h)->tt) & 0x0F) < (9+1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,599,"int traverseephemeron(global_State *, Table *, int)");
      }
      list = &g->allweak;
      goto LAB_0011cbab;
    }
  }
  else if (g->gcstate != '\0') {
LAB_0011cb7a:
    if ((h->tt & 0xe) < 10) {
      genlink(g,(GCObject *)h);
      return local_34;
    }
    __assert_fail("(((h)->tt) & 0x0F) < (9+1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                  ,0x259,"int traverseephemeron(global_State *, Table *, int)");
  }
  if (9 < (h->tt & 0xe)) {
    __assert_fail("(((h)->tt) & 0x0F) < (9+1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                  ,0x253,"int traverseephemeron(global_State *, Table *, int)");
  }
  list = &g->grayagain;
LAB_0011cbab:
  linkgclist_((GCObject *)h,&h->gclist,list);
  return local_34;
}

Assistant:

static int traverseephemeron (global_State *g, Table *h, int inv) {
  int marked = 0;  /* true if an object is marked in this traversal */
  int hasclears = 0;  /* true if table has white keys */
  int hasww = 0;  /* true if table has entry "white-key -> white-value" */
  Node *n, *limit = gnodelast(h);
  unsigned int i;
  /* traverse array part */
  for (i = 0; i < h->sizearray; i++) {
    if (valiswhite(&h->array[i])) {
      marked = 1;
      reallymarkobject(g, gcvalue(&h->array[i]));
    }
  }
  /* traverse hash part */
  for (n = gnode(h, 0); n < limit; n++) {
    if (ttisnil(gval(n)))  /* entry is empty? */
      removeentry(n);  /* remove it */
    else if (iscleared(g, gcvalueN(gkey(n)))) {  /* key is not marked (yet)? */
      hasclears = 1;  /* table must be cleared */
      if (valiswhite(gval(n)))  /* value not marked yet? */
        hasww = 1;  /* white-white entry */
    }
    else if (valiswhite(gval(n))) {  /* value not marked yet? */
      marked = 1;
      reallymarkobject(g, gcvalue(gval(n)));  /* mark it now */
    }
  }
  /* link table into proper list */
  if (g->gcstate == GCSpropagate)
    linkgclist(h, g->grayagain);  /* must retraverse it in atomic phase */
  else if (hasww)  /* table has white->white entries? */
    linkgclist(h, g->ephemeron);  /* have to propagate again */
  else if (hasclears)  /* table has white keys? */
    linkgclist(h, g->allweak);  /* may have to clean white keys */
  else
    genlink(g, obj2gco(h));  /* check whether collector still needs to see it */
  return marked;
}